

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void do_cmd_view_map(void)

{
  int iVar1;
  int iVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  size_t sVar5;
  char *prompt;
  wchar_t local_10;
  uint8_t h;
  wchar_t wStack_c;
  uint8_t w;
  wchar_t cx;
  wchar_t cy;
  
  if (Term->view_map_hook == (_func_void_term_ptr *)0x0) {
    screen_save();
    prt("Please wait...",L'\0',L'\0');
    Term_fresh();
    Term_clear();
    uVar4 = tile_width;
    uVar3 = tile_height;
    tile_width = '\x01';
    tile_height = '\x01';
    display_map(&stack0xfffffffffffffff4,&local_10);
    iVar1 = Term->hgt;
    iVar2 = Term->wid;
    sVar5 = strlen("Hit any key to continue");
    put_str("Hit any key to continue",iVar1 + L'\xffffffff',iVar2 / 2 - (int)(sVar5 >> 1));
    Term_gotoxy(local_10,wStack_c);
    anykey();
    tile_height = uVar3;
    tile_width = uVar4;
    screen_load();
  }
  else {
    (*Term->view_map_hook)(Term);
  }
  return;
}

Assistant:

void do_cmd_view_map(void)
{
	int cy, cx;
	uint8_t w, h;
	const char *prompt = "Hit any key to continue";
	if (Term->view_map_hook) {
		(*(Term->view_map_hook))(Term);
		return;
	}
	/* Save screen */
	screen_save();

	/* Note */
	prt("Please wait...", 0, 0);

	/* Flush */
	Term_fresh();

	/* Clear the screen */
	Term_clear();

	/* store the tile multipliers */
	w = tile_width;
	h = tile_height;
	tile_width = 1;
	tile_height = 1;

	/* Display the map */
	display_map(&cy, &cx);

	/* Show the prompt */
	put_str(prompt, Term->hgt - 1, Term->wid / 2 - strlen(prompt) / 2);

	/* Highlight the player */
	Term_gotoxy(cx, cy);

	/* Get any key */
	(void)anykey();

	/* Restore the tile multipliers */
	tile_width = w;
	tile_height = h;

	/* Load screen */
	screen_load();
}